

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ColumnIndex * __thiscall
duckdb_parquet::ColumnIndex::operator=(ColumnIndex *this,ColumnIndex *other212)

{
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->null_pages,
             &(other212->null_pages).super_vector<bool,_std::allocator<bool>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->min_values,
              &(other212->min_values).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->max_values,
              &(other212->max_values).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this->boundary_order = other212->boundary_order;
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->null_counts).super_vector<long,_std::allocator<long>_>,
             &(other212->null_counts).super_vector<long,_std::allocator<long>_>);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->repetition_level_histograms).super_vector<long,_std::allocator<long>_>,
             &(other212->repetition_level_histograms).super_vector<long,_std::allocator<long>_>);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->definition_level_histograms).super_vector<long,_std::allocator<long>_>,
             &(other212->definition_level_histograms).super_vector<long,_std::allocator<long>_>);
  this->__isset = other212->__isset;
  return this;
}

Assistant:

ColumnIndex& ColumnIndex::operator=(const ColumnIndex& other212) {
  null_pages = other212.null_pages;
  min_values = other212.min_values;
  max_values = other212.max_values;
  boundary_order = other212.boundary_order;
  null_counts = other212.null_counts;
  repetition_level_histograms = other212.repetition_level_histograms;
  definition_level_histograms = other212.definition_level_histograms;
  __isset = other212.__isset;
  return *this;
}